

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int estimate_obmc_pref_error(MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,uint *sse)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  undefined8 in_RDX;
  long *in_RSI;
  MV *in_RDI;
  int subpel_y_q3;
  int subpel_x_q3;
  int ref_stride;
  uint8_t *ref;
  int32_t *mask;
  int32_t *src;
  MSBuffers *ms_buffers;
  aom_variance_fn_ptr_t *vfp;
  
  lVar2 = *in_RSI;
  lVar3 = in_RSI[7];
  lVar4 = in_RSI[8];
  puVar7 = get_buf_from_mv((buf_2d *)in_RSI[2],*in_RDI);
  uVar1 = *(undefined4 *)(in_RSI[2] + 0x18);
  iVar5 = get_subpel_part((int)in_RDI->col);
  iVar6 = get_subpel_part((int)in_RDI->row);
  iVar5 = (**(code **)(lVar2 + 0x68))(puVar7,uVar1,iVar5,iVar6,lVar3,lVar4,in_RDX);
  return iVar5;
}

Assistant:

static inline int estimate_obmc_pref_error(
    const MV *this_mv, const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const int32_t *src = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int ref_stride = ms_buffers->ref->stride;

  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  return vfp->osvf(ref, ref_stride, subpel_x_q3, subpel_y_q3, src, mask, sse);
}